

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O2

void RecalcMarshalStorageSize(SstStream Stream)

{
  long lVar1;
  void *pvVar2;
  void *pvVar3;
  size_t sVar4;
  
  pvVar3 = Stream->WriterMarshalData;
  if ((long)*(int *)((long)pvVar3 + 0x30) != 0) {
    lVar1 = (long)*(int *)((long)pvVar3 + 0x30) * 0x18;
    sVar4 = (size_t)(int)(*(int *)(*(long *)((long)pvVar3 + 0x38) + -4 + lVar1) +
                          *(int *)(*(long *)((long)pvVar3 + 0x38) + -8 + lVar1) + 7U & 0xfffffff8);
    pvVar2 = realloc(Stream->D,sVar4 + 8);
    Stream->D = pvVar2;
    memset((void *)((long)pvVar2 + Stream->DataSize),0,sVar4 - Stream->DataSize);
    Stream->DataSize = sVar4;
  }
  if ((long)*(int *)((long)pvVar3 + 0x18) != 0) {
    lVar1 = (long)*(int *)((long)pvVar3 + 0x18) * 0x18;
    sVar4 = (size_t)(int)(*(int *)(*(long *)((long)pvVar3 + 0x20) + -4 + lVar1) +
                          *(int *)(*(long *)((long)pvVar3 + 0x20) + -8 + lVar1) + 7U & 0xfffffff8);
    pvVar3 = realloc(Stream->M,sVar4 + 8);
    Stream->M = pvVar3;
    memset((void *)((long)pvVar3 + Stream->MetadataSize),0,sVar4 - Stream->MetadataSize);
    Stream->MetadataSize = sVar4;
  }
  return;
}

Assistant:

static void RecalcMarshalStorageSize(SstStream Stream)
{
    struct FFSWriterMarshalBase *Info = Stream->WriterMarshalData;
    if (Info->DataFieldCount)
    {
        FMFieldList LastDataField;
        size_t NewDataSize;
        LastDataField = &Info->DataFields[Info->DataFieldCount - 1];
        NewDataSize = (LastDataField->field_offset + LastDataField->field_size + 7) & ~7;
        Stream->D = realloc(Stream->D, NewDataSize + 8);
        memset((char *)(Stream->D) + Stream->DataSize, 0, NewDataSize - Stream->DataSize);
        Stream->DataSize = NewDataSize;
    }
    if (Info->MetaFieldCount)
    {
        FMFieldList LastMetaField;
        size_t NewMetaSize;
        LastMetaField = &Info->MetaFields[Info->MetaFieldCount - 1];
        NewMetaSize = (LastMetaField->field_offset + LastMetaField->field_size + 7) & ~7;
        Stream->M = realloc(Stream->M, NewMetaSize + 8);
        memset((char *)(Stream->M) + Stream->MetadataSize, 0, NewMetaSize - Stream->MetadataSize);
        Stream->MetadataSize = NewMetaSize;
    }
}